

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::InsertIncludes
          (ConversionStream *this,String *GLSLSource,
          IShaderSourceInputStreamFactory *pSourceStreamFactory)

{
  bool bVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  char *pcVar3;
  void *pvVar4;
  size_type sVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  char *pcVar7;
  __ireturn_type _Var8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  RefCntAutoPtr<Diligent::IFileStream> pIncludeDataStream;
  RefCntAutoPtr<Diligent::DataBlobImpl> pIncludeData;
  String IncludeName;
  String IncludeFileLowercase;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ProcessedIncludes;
  string local_50;
  
  ProcessedIncludes._M_h._M_buckets = &ProcessedIncludes._M_h._M_single_bucket;
  ProcessedIncludes._M_h._M_bucket_count = 1;
  ProcessedIncludes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ProcessedIncludes._M_h._M_element_count = 0;
  ProcessedIncludes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ProcessedIncludes._M_h._M_rehash_policy._M_next_resize = 0;
  ProcessedIncludes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  do {
    pcVar3 = (GLSLSource->_M_dataplus)._M_p;
    sVar5 = GLSLSource->_M_string_length;
    _Var6._M_current = pcVar3 + sVar5;
    local_f0._M_current = pcVar3;
    do {
      do {
        if (local_f0._M_current == pcVar3 + sVar5) goto LAB_001c0255;
        IncludeName._M_dataplus._M_p = pcVar3 + sVar5;
        _Var2 = Parsing::
                SkipDelimitersAndComments<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                          (&local_f0,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&IncludeName,(char *)0x0,SKIP_COMMENT_FLAG_ALL);
        pcVar3 = (GLSLSource->_M_dataplus)._M_p;
        sVar5 = GLSLSource->_M_string_length;
        local_f0 = _Var2;
        if (_Var2._M_current == pcVar3 + sVar5) goto LAB_001c0255;
        local_f0._M_current = _Var2._M_current + 1;
      } while (*_Var2._M_current != '#');
      IncludeName._M_dataplus._M_p = pcVar3 + sVar5;
      local_f0 = Parsing::
                 SkipDelimitersAndComments<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                           (&local_f0,
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&IncludeName,(char *)0x0,SKIP_COMMENT_FLAG_ALL);
      pcVar3 = (GLSLSource->_M_dataplus)._M_p;
      sVar5 = GLSLSource->_M_string_length;
      _Var6 = _Var2;
      if (local_f0._M_current == pcVar3 + sVar5) break;
      IncludeName._M_dataplus._M_p = pcVar3 + sVar5;
      bVar1 = Parsing::SkipString<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                        (&local_f0,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&IncludeName,"include",&local_f0);
      pcVar3 = (GLSLSource->_M_dataplus)._M_p;
      sVar5 = GLSLSource->_M_string_length;
    } while (!bVar1);
LAB_001c0255:
    if (local_f0._M_current == pcVar3 + sVar5) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&ProcessedIncludes._M_h);
      return;
    }
    IncludeName._M_dataplus._M_p = pcVar3 + sVar5;
    local_f0 = Parsing::
               SkipDelimitersAndComments<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                         (&local_f0,
                          (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&IncludeName,(char *)0x0,SKIP_COMMENT_FLAG_ALL);
    if (local_f0._M_current == (GLSLSource->_M_dataplus)._M_p + GLSLSource->_M_string_length) {
      LogError<true,char[40]>
                (false,"InsertIncludes",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x2f9,(char (*) [40])"Unexpected EOF after #include directive");
    }
    if ((*local_f0._M_current != '\"') && (*local_f0._M_current != '<')) {
      LogError<true,char[52]>
                (false,"InsertIncludes",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x2fd,(char (*) [52])"Missing open quotes or \'<\' after #include directive");
    }
    pcVar3 = (GLSLSource->_M_dataplus)._M_p + GLSLSource->_M_string_length;
    pcVar7 = local_f0._M_current + 1;
    for (local_f0._M_current = pcVar7; local_f0._M_current != pcVar3;
        local_f0._M_current = local_f0._M_current + 1) {
      if ((*local_f0._M_current == '\"') || (*local_f0._M_current == '>')) {
        if (local_f0._M_current != pcVar3) goto LAB_001c0337;
        break;
      }
    }
    LogError<true,char[55]>
              (false,"InsertIncludes",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x307,(char (*) [55])"Missing closing quotes or \'>\' after #include directive");
LAB_001c0337:
    IncludeName._M_dataplus._M_p = (pointer)&IncludeName.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&IncludeName,pcVar7,local_f0._M_current);
    local_f0._M_current = local_f0._M_current + 1;
    std::__cxx11::string::erase(GLSLSource,_Var6._M_current);
    std::__cxx11::string::string((string *)&local_50,(string *)&IncludeName);
    StrToLower(&IncludeFileLowercase,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    _Var8 = std::__detail::
            _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)&ProcessedIncludes,&IncludeFileLowercase);
    if (((undefined1  [16])_Var8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pIncludeDataStream.m_pObject = (IFileStream *)0x0;
      pIncludeData.m_pObject = (DataBlobImpl *)0x0;
      (*(pSourceStreamFactory->super_IObject)._vptr_IObject[4])
                (pSourceStreamFactory,IncludeName._M_dataplus._M_p,(DataBlobImpl *)&pIncludeData);
      RefCntAutoPtr<Diligent::IFileStream>::DoublePtrHelper<Diligent::IFileStream>::~DoublePtrHelper
                ((DoublePtrHelper<Diligent::IFileStream> *)&pIncludeData);
      if (pIncludeDataStream.m_pObject == (IFileStream *)0x0) {
        LogError<true,char[29],std::__cxx11::string>
                  (false,"InsertIncludes",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x31c,(char (*) [29])"Failed to open include file ",&IncludeName);
      }
      DataBlobImpl::Create((DataBlobImpl *)&pIncludeData,0,(void *)0x0);
      (*((pIncludeDataStream.m_pObject)->super_IObject)._vptr_IObject[5])();
      pvVar4 = DataBlobImpl::GetConstDataPtr(pIncludeData.m_pObject,0);
      DataBlobImpl::GetSize(pIncludeData.m_pObject);
      std::__cxx11::string::insert
                ((ulong)GLSLSource,_Var6._M_current + -(long)(GLSLSource->_M_dataplus)._M_p,
                 (ulong)pvVar4);
      RefCntAutoPtr<Diligent::DataBlobImpl>::Release(&pIncludeData);
      RefCntAutoPtr<Diligent::IFileStream>::Release(&pIncludeDataStream);
    }
    std::__cxx11::string::~string((string *)&IncludeFileLowercase);
    std::__cxx11::string::~string((string *)&IncludeName);
  } while( true );
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::InsertIncludes(String& GLSLSource, IShaderSourceInputStreamFactory* pSourceStreamFactory)
{
    // Put all the includes into the set to avoid multiple inclusion
    std::unordered_set<String> ProcessedIncludes;

    try
    {
        do
        {
            // Find the first #include statement
            auto Pos             = GLSLSource.begin();
            auto IncludeStartPos = GLSLSource.end();
            while (Pos != GLSLSource.end())
            {
                // #   include "TestFile.fxh"
                Pos = SkipDelimitersAndComments(Pos, GLSLSource.end());
                if (Pos == GLSLSource.end())
                    break;
                if (*Pos == '#')
                {
                    IncludeStartPos = Pos;
                    // #   include "TestFile.fxh"
                    // ^
                    ++Pos;
                    // #   include "TestFile.fxh"
                    //  ^
                    Pos = SkipDelimitersAndComments(Pos, GLSLSource.end());
                    if (Pos == GLSLSource.end())
                    {
                        // End of the file reached - break
                        break;
                    }
                    // #   include "TestFile.fxh"
                    //     ^
                    if (Parsing::SkipString(Pos, GLSLSource.end(), "include", Pos))
                    {
                        // #   include "TestFile.fxh"
                        //            ^
                        break;
                    }
                    else
                    {
                        // This is not an #include directive:
                        // #define MACRO
                        // Continue search through the file
                    }
                }
                else
                    ++Pos;
            }

            // No more #include found
            if (Pos == GLSLSource.end())
                break;

            // Find open quotes
            Pos = SkipDelimitersAndComments(Pos, GLSLSource.end());
            if (Pos == GLSLSource.end())
                LOG_ERROR_AND_THROW("Unexpected EOF after #include directive");
            // #   include "TestFile.fxh"
            //             ^
            if (*Pos != '\"' && *Pos != '<')
                LOG_ERROR_AND_THROW("Missing open quotes or \'<\' after #include directive");
            ++Pos;
            // #   include "TestFile.fxh"
            //              ^
            auto IncludeNameStartPos = Pos;
            // Find closing quotes
            while (Pos != GLSLSource.end() && *Pos != '\"' && *Pos != '>') ++Pos;
            // #   include "TestFile.fxh"
            //                          ^
            if (Pos == GLSLSource.end())
                LOG_ERROR_AND_THROW("Missing closing quotes or \'>\' after #include directive");

            // Get the name of the include file
            auto IncludeName = String(IncludeNameStartPos, Pos);
            ++Pos;
            // #   include "TestFile.fxh"
            // ^                         ^
            // IncludeStartPos           Pos
            GLSLSource.erase(IncludeStartPos, Pos);

            // Convert the name to lower case
            String IncludeFileLowercase = StrToLower(IncludeName);
            // Insert the lower-case name into the set
            auto It = ProcessedIncludes.insert(IncludeFileLowercase);
            // If the name was actually inserted, which means the include encountered for the first time,
            // replace the text with the file content
            if (It.second)
            {
                RefCntAutoPtr<IFileStream> pIncludeDataStream;
                pSourceStreamFactory->CreateInputStream(IncludeName.c_str(), &pIncludeDataStream);
                if (!pIncludeDataStream)
                    LOG_ERROR_AND_THROW("Failed to open include file ", IncludeName);
                auto pIncludeData = DataBlobImpl::Create();
                pIncludeDataStream->ReadBlob(pIncludeData);

                // Get include text
                const Char* IncludeText = pIncludeData->GetConstDataPtr<Char>();
                size_t      NumSymbols  = pIncludeData->GetSize();

                // Insert the text into source
                GLSLSource.insert(IncludeStartPos - GLSLSource.begin(), IncludeText, NumSymbols);
            }
        } while (true);
    }
    catch (const std::pair<std::string::iterator, const char*>& ErrInfo)
    {
        LOG_ERROR_AND_THROW("Unable to process includes: ", ErrInfo.second);
    }
}